

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_benchmarker.hpp
# Opt level: O3

vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_> * __thiscall
hayai::Benchmarker::GetTests
          (vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>
           *__return_storage_ptr__,Benchmarker *this)

{
  pointer *pppTVar1;
  iterator __position;
  pointer ppTVar2;
  ulong uVar3;
  long lVar4;
  
  (__return_storage_ptr__->
  super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppTVar2 = (this->_tests).
            super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_tests).
      super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<hayai::TestDescriptor*,std::allocator<hayai::TestDescriptor*>>::
        _M_realloc_insert<hayai::TestDescriptor*const&>
                  ((vector<hayai::TestDescriptor*,std::allocator<hayai::TestDescriptor*>> *)
                   __return_storage_ptr__,__position,(TestDescriptor **)((long)ppTVar2 + lVar4));
      }
      else {
        *__position._M_current = *(TestDescriptor **)((long)ppTVar2 + lVar4);
        pppTVar1 = &(__return_storage_ptr__->
                    super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      uVar3 = uVar3 + 1;
      ppTVar2 = (this->_tests).
                super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
    } while (uVar3 < (ulong)((long)(this->_tests).
                                   super__Vector_base<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestDescriptor*> GetTests() const
        {
            std::vector<TestDescriptor*> tests;

            std::size_t index = 0;
            while (index < _tests.size())
                tests.push_back(_tests[index++]);

            return tests;
        }